

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCase.cpp
# Opt level: O2

void __thiscall
xe::TestHierarchyBuilder::TestHierarchyBuilder(TestHierarchyBuilder *this,TestRoot *root)

{
  _Rb_tree_header *p_Var1;
  
  this->m_root = root;
  p_Var1 = &(this->m_groupMap)._M_t._M_impl.super__Rb_tree_header;
  (this->m_groupMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_groupMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_groupMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_groupMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_groupMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  addChildGroupsToMap(&this->m_groupMap,&root->super_TestGroup);
  return;
}

Assistant:

TestHierarchyBuilder::TestHierarchyBuilder (TestRoot* root)
	: m_root(root)
{
	addChildGroupsToMap(m_groupMap, root);
}